

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  bool local_1;
  
  jVar1 = storage_kind(in_RDI);
  this_00 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
            (ulong)(byte)(jVar1 - short_str);
  switch(this_00) {
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0:
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x8:
    local_1 = true;
    break;
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x1:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
              (in_stack_ffffffffffffffd0);
    json_const_reference_storage::value((json_const_reference_storage *)0x61529d);
    local_1 = is_string(this_00);
    break;
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x2:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffffd0);
    json_reference_storage::value((json_reference_storage *)0x6152c8);
    local_1 = is_string(this_00);
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_string() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                    return true;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().is_string();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_string();
                default:
                    return false;
            }
        }